

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *local_88;
  pthread_t local_80;
  pthread_t thread;
  int *a;
  LogMessage local_60 [2];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string command;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  command.field_2._8_8_ = argv;
  argv_local._0_4_ = argc;
  google::InitGoogleLogging(*argv);
  google::ParseCommandLineFlags((int *)&argv_local,(char ***)((long)&command.field_2 + 8),true);
  google::InstallFailureSignalHandler();
  if ((int)argv_local < 2) {
    local_88 = "none";
  }
  else {
    local_88 = *(char **)(command.field_2._8_8_ + 8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,local_88,&local_39);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"segv");
  if (bVar1) {
    google::LogMessage::LogMessage
              (local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x53);
    poVar2 = google::LogMessage::stream(local_60);
    std::operator<<(poVar2,"create the log file");
    google::LogMessage::~LogMessage(local_60);
    google::LogMessage::LogMessage
              ((LogMessage *)&a,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x54);
    poVar2 = google::LogMessage::stream((LogMessage *)&a);
    std::operator<<(poVar2,"a message before segv");
    google::LogMessage::~LogMessage((LogMessage *)&a);
    thread = (pthread_t)&DAT_0000dead;
    _DAT_0000dead = 0;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"loop");
    if (bVar1) {
      fprintf(_stderr,"looping\n");
      do {
      } while( true );
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"die_in_thread");
    if (bVar1) {
      pthread_create(&local_80,(pthread_attr_t *)0x0,DieInThread,(void *)0x0);
      pthread_join(local_80,(void **)0x0);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"dump_to_stdout");
      if (bVar1) {
        google::InstallFailureWriter(WriteToStdout);
        abort();
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"installed");
      __stream = _stderr;
      if (bVar1) {
        bVar1 = google::glog_internal_namespace_::IsFailureSignalHandlerInstalled();
        pcVar3 = "false";
        if (bVar1) {
          pcVar3 = "true";
        }
        fprintf(__stream,"signal handler installed: %s\n",pcVar3);
      }
      else {
        puts("OK");
      }
    }
  }
  argv_local._4_4_ = 0;
  std::__cxx11::string::~string((string *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
#if defined(HAVE_STACKTRACE) && defined(HAVE_SYMBOLIZE)
  InitGoogleLogging(argv[0]);
#ifdef HAVE_LIB_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  InstallFailureSignalHandler();
  const std::string command = argc > 1 ? argv[1] : "none";
  if (command == "segv") {
    // We'll check if this is outputted.
    LOG(INFO) << "create the log file";
    LOG(INFO) << "a message before segv";
    // We assume 0xDEAD is not writable.
    int *a = (int*)0xDEAD;
    *a = 0;
  } else if (command == "loop") {
    fprintf(stderr, "looping\n");
    while (true);
  } else if (command == "die_in_thread") {
#if defined(HAVE_PTHREAD)
    pthread_t thread;
    pthread_create(&thread, NULL, &DieInThread, NULL);
    pthread_join(thread, NULL);
#else
    fprintf(stderr, "no pthread\n");
    return 1;
#endif
  } else if (command == "dump_to_stdout") {
    InstallFailureWriter(WriteToStdout);
    abort();
  } else if (command == "installed") {
    fprintf(stderr, "signal handler installed: %s\n",
        IsFailureSignalHandlerInstalled() ? "true" : "false");
  } else {
    // Tell the shell script
    puts("OK");
  }
#endif
  return 0;
}